

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathRect
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawCornerFlags rounding_corners)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImVec2 *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float radius;
  ImVec2 local_38;
  
  uVar2 = ~rounding_corners;
  fVar8 = 0.5;
  if ((uVar2 & 0xc) != 0) {
    fVar8 = 1.0;
  }
  fVar9 = 0.5;
  if ((uVar2 & 3) != 0) {
    fVar9 = fVar8;
  }
  fVar8 = 0.5;
  if ((uVar2 & 10) != 0) {
    fVar8 = 1.0;
  }
  fVar7 = 0.5;
  if ((uVar2 & 5) != 0) {
    fVar7 = fVar8;
  }
  if (rounding_corners != 0) {
    fVar8 = ABS(b->x - a->x) * fVar9 + -1.0;
    if (fVar8 <= rounding) {
      rounding = fVar8;
    }
    fVar8 = ABS(b->y - a->y) * fVar7 + -1.0;
    if (fVar8 <= rounding) {
      rounding = fVar8;
    }
    if (0.0 < rounding) {
      fVar8 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar8 = rounding;
      }
      fVar9 = 0.0;
      if ((rounding_corners & 2U) != 0) {
        fVar9 = rounding;
      }
      fVar7 = 0.0;
      if ((rounding_corners & 8U) != 0) {
        fVar7 = rounding;
      }
      radius = 0.0;
      if ((rounding_corners & 4U) != 0) {
        radius = rounding;
      }
      local_38.x = a->x + fVar8;
      local_38.y = a->y + fVar8;
      PathArcToFast(this,&local_38,fVar8,6,9);
      local_38.x = b->x - fVar9;
      local_38.y = a->y + fVar9;
      PathArcToFast(this,&local_38,fVar9,9,0xc);
      local_38.x = b->x - fVar7;
      local_38.y = b->y - fVar7;
      PathArcToFast(this,&local_38,fVar7,0,3);
      local_38.x = a->x + radius;
      local_38.y = b->y - radius;
      PathArcToFast(this,&local_38,radius,3,6);
      return;
    }
  }
  iVar5 = (this->_Path).Size;
  iVar6 = (this->_Path).Capacity;
  if (iVar5 == iVar6) {
    iVar5 = iVar5 + 1;
    if (iVar6 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar6 < iVar5) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar5;
    }
  }
  (this->_Path).Data[(this->_Path).Size] = *a;
  iVar6 = (this->_Path).Size;
  iVar4 = (this->_Path).Capacity;
  iVar5 = iVar6 + 1;
  (this->_Path).Size = iVar5;
  fVar8 = b->x;
  fVar9 = a->y;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar6;
    }
  }
  pIVar1 = (this->_Path).Data;
  iVar5 = (this->_Path).Size;
  pIVar1[iVar5].x = fVar8;
  pIVar1[iVar5].y = fVar9;
  iVar6 = (this->_Path).Size;
  iVar4 = (this->_Path).Capacity;
  iVar5 = iVar6 + 1;
  (this->_Path).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar6;
    }
  }
  (this->_Path).Data[(this->_Path).Size] = *b;
  iVar6 = (this->_Path).Size;
  iVar4 = (this->_Path).Capacity;
  iVar5 = iVar6 + 1;
  (this->_Path).Size = iVar5;
  fVar8 = a->x;
  fVar9 = b->y;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar6;
    }
  }
  pIVar1 = (this->_Path).Data;
  iVar5 = (this->_Path).Size;
  pIVar1[iVar5].x = fVar8;
  pIVar1[iVar5].y = fVar9;
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawCornerFlags rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}